

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O2

Vec_Int_t * Gia_AigerReadMappingDoc(uchar **ppPos,int nObjs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uchar *puVar11;
  
  puVar11 = *ppPos;
  iVar1 = Gia_AigerReadInt(puVar11);
  *ppPos = puVar11 + 4;
  iVar2 = Gia_AigerReadInt(puVar11 + 4);
  puVar11 = puVar11 + 8;
  *ppPos = puVar11;
  piVar6 = (int *)calloc((long)((iVar2 + 2) * iVar1 + nObjs),4);
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (iVar2 = 0; iVar2 != iVar1; iVar2 = iVar2 + 1) {
    iVar3 = Gia_AigerReadInt(puVar11);
    *ppPos = puVar11 + 4;
    iVar4 = Gia_AigerReadInt(puVar11 + 4);
    puVar11 = puVar11 + 8;
    *ppPos = puVar11;
    piVar6[iVar3] = nObjs;
    lVar8 = (long)nObjs;
    piVar6[lVar8] = iVar4;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    lVar9 = lVar8 << 0x20;
    lVar10 = 0;
    while( true ) {
      lVar9 = lVar9 + 0x100000000;
      if (iVar4 == (int)lVar10) break;
      iVar5 = Gia_AigerReadInt(puVar11);
      piVar6[lVar8 + lVar10 + 1] = iVar5;
      puVar11 = puVar11 + 4;
      *ppPos = puVar11;
      lVar10 = lVar10 + 1;
    }
    nObjs = nObjs + (int)lVar10 + 2;
    *(int *)((long)piVar6 + (lVar9 >> 0x1e)) = iVar3;
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nSize = nObjs;
  pVVar7->nCap = nObjs;
  pVVar7->pArray = piVar6;
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_AigerReadMappingDoc( unsigned char ** ppPos, int nObjs )
{
    int * pMapping, nLuts, LutSize, iRoot, nFanins, i, k, nOffset;
    nLuts    = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    LutSize  = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    pMapping = ABC_CALLOC( int, nObjs + (LutSize + 2) * nLuts );
    nOffset = nObjs;
    for ( i = 0; i < nLuts; i++ )
    {
        iRoot   = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        nFanins = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        pMapping[iRoot] = nOffset;
        // write one
        pMapping[ nOffset++ ] = nFanins; 
        for ( k = 0; k < nFanins; k++ )
        {
            pMapping[ nOffset++ ] = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        }
        pMapping[ nOffset++ ] = iRoot; 
    }
    return Vec_IntAllocArray( pMapping, nOffset );
}